

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FieldMap *this_00;
  IntTConvertor<unsigned_long> *this_01;
  pointer pcVar1;
  bool bVar2;
  FieldBase *msgType;
  FieldBase *pFVar3;
  FieldBase *targetCompID;
  FieldBase *pFVar4;
  IntTConvertor<unsigned_long> *pIVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined8 extraout_RAX;
  logic_error *this_02;
  char *__s;
  Session *pSVar8;
  unsigned_long value;
  byte bVar9;
  Session *pSVar10;
  undefined1 auVar11 [12];
  byte local_13c;
  FieldBase *local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  _func_int *local_e8 [2];
  _Alloc_hider local_d8;
  Application *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  field_metrics local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (FieldMap *)(ctx + 0x70);
  msgType = FieldMap::getFieldRef(this_00,0x23);
  pFVar3 = FieldMap::getFieldRef(this_00,0x31);
  targetCompID = FieldMap::getFieldRef(this_00,0x38);
  pFVar4 = FieldMap::getFieldRef(this_00,0x34);
  local_13c = (byte)siglen;
  bVar9 = (byte)sig | local_13c;
  if (bVar9 == 1) {
    local_138 = FieldMap::getFieldRef(this_00,0x22);
  }
  else {
    local_138 = (FieldBase *)0x0;
  }
  bVar2 = validLogonState(this,(MsgType *)msgType);
  if (!bVar2) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_02,"Logon state is not valid for message");
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = isGoodTime(this,(SendingTime *)pFVar4);
  if (bVar2) {
    bVar2 = isCorrectCompID(this,(SenderCompID *)pFVar3,(TargetCompID *)targetCompID);
    if (bVar2) {
      if ((byte)sig != 0) {
        pFVar4 = (FieldBase *)UInt64Field::getValue((UInt64Field *)local_138);
        pFVar3 = (FieldBase *)SessionState::getNextTargetMsgSeqNum(&this->m_state);
        if (pFVar3 < pFVar4) {
          doTargetTooHigh(this,(Message *)ctx);
          return 0;
        }
      }
      if (local_13c != 0) {
        pFVar4 = (FieldBase *)UInt64Field::getValue((UInt64Field *)local_138);
        pFVar3 = (FieldBase *)SessionState::getNextTargetMsgSeqNum(&this->m_state);
        if (pFVar4 < pFVar3) {
          doTargetTooLow(this,(Message *)ctx);
          return 0;
        }
      }
      pSVar10 = this;
      if (bVar9 != 0) {
        pFVar4 = (FieldBase *)(this->m_state).m_resendRange.first;
        this_01 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.second;
        if ((pFVar4 != (FieldBase *)0x0 || this_01 != (IntTConvertor<unsigned_long> *)0x0) &&
           (pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_138)
           , this_01 <= pIVar5)) {
          IntTConvertor<unsigned_long>::convert_abi_cxx11_
                    (&local_70,(IntTConvertor<unsigned_long> *)pFVar4,value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50,"ResendRequest for messages FROM: ",&local_70);
          puVar6 = (undefined8 *)std::__cxx11::string::append(local_50._M_local_buf);
          pFVar4 = (FieldBase *)(puVar6 + 2);
          if ((FieldBase *)*puVar6 == pFVar4) {
            local_128._16_8_ = pFVar4->_vptr_FieldBase;
            local_128._24_8_ = puVar6[3];
            local_128._0_8_ = (FieldBase *)(local_128 + 0x10);
          }
          else {
            local_128._16_8_ = pFVar4->_vptr_FieldBase;
            local_128._0_8_ = (FieldBase *)*puVar6;
          }
          local_128._8_8_ = puVar6[1];
          *puVar6 = pFVar4;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_90,this_01,local_128._8_8_);
          std::operator+(&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,&local_90);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
          pSVar10 = (Session *)auStack_f8;
          pSVar8 = (Session *)(plVar7 + 2);
          if ((Session *)*plVar7 == pSVar8) {
            auStack_f8._0_8_ = pSVar8->_vptr_Session;
            auStack_f8._8_8_ = plVar7[3];
            local_108._0_8_ = pSVar10;
          }
          else {
            auStack_f8._0_8_ = pSVar8->_vptr_Session;
            local_108._0_8_ = (Session *)*plVar7;
          }
          local_108._8_8_ = plVar7[1];
          *plVar7 = (long)pSVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          SessionState::onEvent(&this->m_state,(string *)local_108);
          if ((Session *)local_108._0_8_ != pSVar10) {
            operator_delete((void *)local_108._0_8_,auStack_f8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((FieldBase *)local_128._0_8_ != (FieldBase *)(local_128 + 0x10)) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_allocated_capacity != &local_40) {
            operator_delete((void *)local_50._M_allocated_capacity,
                            (ulong)(local_40._M_allocated_capacity + 1));
          }
          pFVar4 = (FieldBase *)&(this->m_state).m_resendRange;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          ((ResendRange *)pFVar4)->first = 0;
          (this->m_state).m_resendRange.second = 0;
        }
      }
      if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->m_timestamper)._M_invoker)
                  ((UtcTimeStamp *)local_108,(_Any_data *)&this->m_timestamper);
        (this->m_state).m_lastReceivedTime.super_DateTime.m_date = local_108._8_4_;
        *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.field_0xc =
             local_108._12_4_;
        *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.m_time = auStack_f8._0_4_;
        *(undefined4 *)((long)&(this->m_state).m_lastReceivedTime.super_DateTime.m_time + 4) =
             auStack_f8._4_4_;
        (this->m_state).m_testRequest = 0;
        local_108._0_8_ = &PTR__FieldBase_001f8470;
        local_108._8_4_ = msgType->m_tag;
        auStack_f8._0_8_ = local_e8;
        pcVar1 = (msgType->m_string)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_f8,pcVar1,pcVar1 + (msgType->m_string)._M_string_length);
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = (Application *)0x0;
        local_c8._M_local_buf[0] = '\0';
        local_b8 = msgType->m_metrics;
        local_108._0_8_ = &PTR__FieldBase_001f9500;
        fromCallback(this,(MsgType *)local_108,(Message *)ctx,(SessionID *)&PTR__FieldBase_001f9500)
        ;
        FieldBase::~FieldBase((FieldBase *)local_108);
        return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      auVar11 = std::__throw_bad_function_call();
      if ((Session *)local_108._0_8_ != pSVar10) {
        operator_delete((void *)local_108._0_8_,auStack_f8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((FieldBase *)local_128._0_8_ != pFVar4) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_allocated_capacity != &local_40) {
        operator_delete((void *)local_50._M_allocated_capacity,
                        (ulong)(local_40._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (auVar11._8_4_ != 1) {
        _Unwind_Resume(auVar11._0_8_);
      }
      plVar7 = (long *)__cxa_begin_catch(auVar11._0_8_);
      __s = (char *)(**(code **)(*plVar7 + 0x10))(plVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_108,__s,(allocator<char> *)&local_b0);
      SessionState::onEvent(&this->m_state,(string *)local_108);
      if ((Session *)local_108._0_8_ != (Session *)auStack_f8) {
        operator_delete((void *)local_108._0_8_,auStack_f8._0_8_ + 1);
      }
      disconnect(this);
      __cxa_end_catch();
    }
    else {
      doBadCompID(this,(Message *)ctx);
    }
  }
  else {
    doBadTime(this,(Message *)ctx);
  }
  return 0;
}

Assistant:

bool Session::verify(const Message &msg, bool checkTooHigh, bool checkTooLow) {
  const MsgType *pMsgType = 0;
  const MsgSeqNum *pMsgSeqNum = 0;

  try {
    const Header &header = msg.getHeader();

    pMsgType = FIELD_GET_PTR(header, MsgType);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);
    const SendingTime &sendingTime = FIELD_GET_REF(header, SendingTime);

    if (checkTooHigh || checkTooLow) {
      pMsgSeqNum = FIELD_GET_PTR(header, MsgSeqNum);
    }

    if (!validLogonState(*pMsgType)) {
      throw std::logic_error("Logon state is not valid for message");
    }

    if (!isGoodTime(sendingTime)) {
      doBadTime(msg);
      return false;
    }
    if (!isCorrectCompID(senderCompID, targetCompID)) {
      doBadCompID(msg);
      return false;
    }

    if (checkTooHigh && isTargetTooHigh(*pMsgSeqNum)) {
      doTargetTooHigh(msg);
      return false;
    } else if (checkTooLow && isTargetTooLow(*pMsgSeqNum)) {
      doTargetTooLow(msg);
      return false;
    }

    if ((checkTooHigh || checkTooLow) && m_state.resendRequested()) {
      SessionState::ResendRange range = m_state.resendRange();

      if (*pMsgSeqNum >= range.second) {
        m_state.onEvent(
            "ResendRequest for messages FROM: " + SEQNUM_CONVERTOR::convert(range.first)
            + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + " has been satisfied.");
        m_state.resendRange(0, 0);
      }
    }
  } catch (std::exception &e) {
    m_state.onEvent(e.what());
    disconnect();
    return false;
  }

  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);

  fromCallback(pMsgType ? *pMsgType : MsgType(), msg, m_sessionID);
  return true;
}